

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<double,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
                 int *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  int *piVar1;
  double __y;
  int iVar2;
  int *piVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  unsigned_long *key;
  ulong *key_00;
  ulong *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  double dVar15;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar16;
  tuple<> local_c1;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int *local_88;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_80;
  ulong local_78;
  double local_70;
  size_t *local_68;
  size_t local_60;
  double local_58;
  double *local_50;
  long local_48;
  size_t local_40;
  unsigned_long *local_38;
  
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    return -INFINITY;
  }
  local_c0 = 0.0;
  local_88 = Xc_ind;
  local_68 = ix_arr;
  local_60 = st;
  local_50 = Xc;
  local_40 = col_num;
  if (st <= end) {
    key = ix_arr + st;
    local_c0 = 0.0;
    do {
      local_80._M_head_impl = key;
      pVar16 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::
               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_unsigned_long_&> *)&local_80,&local_c1);
      local_c0 = local_c0 + *(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
      st = st + 1;
      key = key + 1;
    } while (st <= end);
  }
  piVar3 = local_88;
  if (local_c0 <= 0.0) {
    return -INFINITY;
  }
  lVar13 = (long)Xc_indptr[local_40];
  lVar5 = (long)Xc_indptr[local_40 + 1];
  local_48 = lVar5 + -1;
  key_00 = local_68 + local_60;
  puVar7 = local_68 + end + 1;
  uVar6 = (long)puVar7 - (long)key_00 >> 3;
  if (0 < (long)uVar6) {
    do {
      uVar8 = uVar6 >> 1;
      uVar12 = ~uVar8 + uVar6;
      uVar6 = uVar8;
      if (key_00[uVar8] < (ulong)(long)local_88[lVar13]) {
        key_00 = key_00 + uVar8 + 1;
        uVar6 = uVar12;
      }
    } while (0 < (long)uVar6);
  }
  uVar6 = (ulong)local_88[lVar5 + -1];
  local_38 = local_68 + end;
  piVar11 = local_88;
  local_78 = uVar6;
  local_70 = (double)lVar5;
  if (missing_action == Fail) {
    if (lVar5 != lVar13 && key_00 != puVar7) {
      local_b0 = 0.0;
      local_b8 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      while (uVar8 = *key_00, uVar8 <= uVar6) {
        piVar1 = piVar11 + lVar13;
        iVar2 = *piVar1;
        if (iVar2 == (int)uVar8) {
          local_80._M_head_impl = key_00;
          pVar16 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_80,&local_c1);
          local_a0 = *(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
          local_58 = local_50[lVar13];
          local_a8 = local_58 * local_58;
          local_b0 = fma(local_a0,local_58,local_b0);
          local_b8 = fma(local_a0,local_a8,local_b8);
          local_90 = fma(local_a0,local_58 * local_a8,local_90);
          local_98 = fma(local_a0,local_a8 * local_a8,local_98);
          piVar11 = local_88;
          if ((key_00 == local_38) || (lVar13 == local_48)) break;
          piVar14 = piVar1 + 1;
          key_00 = key_00 + 1;
          uVar8 = (long)piVar3 + (lVar5 * 4 - (long)piVar14) >> 2;
          uVar6 = local_78;
          if (0 < (long)uVar8) {
            do {
              uVar12 = uVar8 >> 1;
              uVar9 = ~uVar12 + uVar8;
              uVar8 = uVar12;
              if ((ulong)(long)piVar14[uVar12] < *key_00) {
                piVar14 = piVar14 + uVar12 + 1;
                uVar8 = uVar9;
              }
            } while (0 < (long)uVar8);
          }
LAB_00126de8:
          lVar13 = (long)piVar14 - (long)piVar11 >> 2;
        }
        else {
          if (iVar2 <= (int)uVar8) {
            piVar14 = piVar1 + 1;
            uVar12 = (long)piVar3 + (lVar5 * 4 - (long)(piVar1 + 1)) >> 2;
            while (0 < (long)uVar12) {
              uVar9 = uVar12 >> 1;
              uVar10 = ~uVar9 + uVar12;
              uVar12 = uVar9;
              if ((ulong)(long)piVar14[uVar9] < uVar8) {
                piVar14 = piVar14 + uVar9 + 1;
                uVar12 = uVar10;
              }
            }
            goto LAB_00126de8;
          }
          key_00 = key_00 + 1;
          uVar8 = (long)puVar7 - (long)key_00 >> 3;
          while (0 < (long)uVar8) {
            uVar12 = uVar8 >> 1;
            uVar9 = ~uVar12 + uVar8;
            uVar8 = uVar12;
            if (key_00[uVar12] < (ulong)(long)iVar2) {
              key_00 = key_00 + uVar12 + 1;
              uVar8 = uVar9;
            }
          }
        }
        if ((key_00 == puVar7) || ((double)lVar13 == local_70)) break;
      }
    }
    else {
      local_98 = 0.0;
      local_90 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
    }
  }
  else {
    if (lVar5 != lVar13 && key_00 != puVar7) {
      local_b0 = 0.0;
      local_b8 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      while (uVar8 = *key_00, uVar8 <= uVar6) {
        piVar1 = piVar11 + lVar13;
        iVar2 = *piVar1;
        if (iVar2 == (int)uVar8) {
          local_80._M_head_impl = key_00;
          pVar16 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,key_00,(piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_80,&local_c1);
          dVar15 = *(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
          __y = local_50[lVar13];
          if ((ulong)ABS(__y) < 0x7ff0000000000000) {
            local_a8 = __y * __y;
            local_a0 = dVar15;
            local_58 = __y;
            local_b0 = fma(dVar15,__y,local_b0);
            local_b8 = fma(local_a0,local_a8,local_b8);
            local_90 = fma(local_a0,local_58 * local_a8,local_90);
            local_98 = fma(local_a0,local_a8 * local_a8,local_98);
          }
          else {
            local_c0 = local_c0 - dVar15;
          }
          piVar11 = local_88;
          if ((key_00 == local_38) || (lVar13 == local_48)) break;
          piVar14 = piVar1 + 1;
          key_00 = key_00 + 1;
          uVar8 = (long)piVar3 + (lVar5 * 4 - (long)piVar14) >> 2;
          uVar6 = local_78;
          if (0 < (long)uVar8) {
            do {
              uVar12 = uVar8 >> 1;
              uVar9 = ~uVar12 + uVar8;
              uVar8 = uVar12;
              if ((ulong)(long)piVar14[uVar12] < *key_00) {
                piVar14 = piVar14 + uVar12 + 1;
                uVar8 = uVar9;
              }
            } while (0 < (long)uVar8);
          }
LAB_00126b6c:
          lVar13 = (long)piVar14 - (long)piVar11 >> 2;
        }
        else {
          if (iVar2 <= (int)uVar8) {
            piVar14 = piVar1 + 1;
            uVar12 = (long)piVar3 + (lVar5 * 4 - (long)(piVar1 + 1)) >> 2;
            while (0 < (long)uVar12) {
              uVar9 = uVar12 >> 1;
              uVar10 = ~uVar9 + uVar12;
              uVar12 = uVar9;
              if ((ulong)(long)piVar14[uVar9] < uVar8) {
                piVar14 = piVar14 + uVar9 + 1;
                uVar12 = uVar10;
              }
            }
            goto LAB_00126b6c;
          }
          key_00 = key_00 + 1;
          uVar8 = (long)puVar7 - (long)key_00 >> 3;
          while (0 < (long)uVar8) {
            uVar12 = uVar8 >> 1;
            uVar9 = ~uVar12 + uVar8;
            uVar8 = uVar12;
            if (key_00[uVar12] < (ulong)(long)iVar2) {
              key_00 = key_00 + uVar12 + 1;
              uVar8 = uVar9;
            }
          }
        }
        if ((key_00 == puVar7) || ((double)lVar13 == local_70)) break;
      }
    }
    else {
      local_98 = 0.0;
      local_90 = 0.0;
      local_b8 = 0.0;
      local_b0 = 0.0;
    }
    if (local_c0 <= 0.0) {
      return -INFINITY;
    }
  }
  if ((1.0 < local_c0) && ((local_b8 != 0.0 || (NAN(local_b8))))) {
    if ((local_b8 != local_b0 * local_b0) || (NAN(local_b8) || NAN(local_b0 * local_b0))) {
      local_70 = local_b0 / local_c0;
      local_a0 = local_70 * local_70;
      local_a8 = local_b8 / local_c0 - local_a0;
      if ((!NAN(local_a8)) &&
         ((2.220446049250313e-16 < local_a8 ||
          (bVar4 = check_more_than_two_unique_values<double,int>
                             (local_68,local_60,end,local_40,Xc_indptr,piVar11,local_50,
                              missing_action), bVar4)))) {
        if (local_a8 <= 0.0) {
          return 0.0;
        }
        dVar15 = (local_a0 * local_70 * local_70 * local_c0 +
                 local_b0 * -4.0 * local_a0 * local_70 +
                 local_b8 * 6.0 * local_a0 + local_90 * -4.0 * local_70 + local_98) /
                 (local_a8 * local_a8 * local_c0);
        if ((long)ABS(dVar15) < 0x7ff0000000000000) {
          if (dVar15 <= 0.0) {
            return 0.0;
          }
          return dVar15;
        }
        return -INFINITY;
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}